

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void MergeUVRow_SSE2(uint8_t *src_u,uint8_t *src_v,uint8_t *dst_uv,int width)

{
  uint8_t *puVar1;
  bool bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  int iVar35;
  long lVar36;
  int width_local;
  uint8_t *dst_uv_local;
  uint8_t *src_v_local;
  uint8_t *src_u_local;
  
  lVar36 = (long)src_v - (long)src_u;
  do {
    uVar3 = *src_u;
    uVar4 = src_u[1];
    uVar5 = src_u[2];
    uVar6 = src_u[3];
    uVar7 = src_u[4];
    uVar8 = src_u[5];
    uVar9 = src_u[6];
    uVar10 = src_u[7];
    uVar11 = src_u[8];
    uVar12 = src_u[9];
    uVar13 = src_u[10];
    uVar14 = src_u[0xb];
    uVar15 = src_u[0xc];
    uVar16 = src_u[0xd];
    uVar17 = src_u[0xe];
    uVar18 = src_u[0xf];
    puVar1 = src_u + lVar36;
    uVar19 = *puVar1;
    uVar20 = puVar1[1];
    uVar21 = puVar1[2];
    uVar22 = puVar1[3];
    uVar23 = puVar1[4];
    uVar24 = puVar1[5];
    uVar25 = puVar1[6];
    uVar26 = puVar1[7];
    uVar27 = puVar1[8];
    uVar28 = puVar1[9];
    uVar29 = puVar1[10];
    uVar30 = puVar1[0xb];
    uVar31 = puVar1[0xc];
    uVar32 = puVar1[0xd];
    uVar33 = puVar1[0xe];
    uVar34 = puVar1[0xf];
    src_u = src_u + 0x10;
    *dst_uv = uVar3;
    dst_uv[1] = uVar19;
    dst_uv[2] = uVar4;
    dst_uv[3] = uVar20;
    dst_uv[4] = uVar5;
    dst_uv[5] = uVar21;
    dst_uv[6] = uVar6;
    dst_uv[7] = uVar22;
    dst_uv[8] = uVar7;
    dst_uv[9] = uVar23;
    dst_uv[10] = uVar8;
    dst_uv[0xb] = uVar24;
    dst_uv[0xc] = uVar9;
    dst_uv[0xd] = uVar25;
    dst_uv[0xe] = uVar10;
    dst_uv[0xf] = uVar26;
    dst_uv[0x10] = uVar11;
    dst_uv[0x11] = uVar27;
    dst_uv[0x12] = uVar12;
    dst_uv[0x13] = uVar28;
    dst_uv[0x14] = uVar13;
    dst_uv[0x15] = uVar29;
    dst_uv[0x16] = uVar14;
    dst_uv[0x17] = uVar30;
    dst_uv[0x18] = uVar15;
    dst_uv[0x19] = uVar31;
    dst_uv[0x1a] = uVar16;
    dst_uv[0x1b] = uVar32;
    dst_uv[0x1c] = uVar17;
    dst_uv[0x1d] = uVar33;
    dst_uv[0x1e] = uVar18;
    dst_uv[0x1f] = uVar34;
    dst_uv = dst_uv + 0x20;
    iVar35 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar35;
  } while (iVar35 != 0 && bVar2);
  return;
}

Assistant:

void MergeUVRow_SSE2(const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* dst_uv,
                     int width) {
  asm volatile(

      "sub         %0,%1                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x00(%0,%1,1),%%xmm1          \n"
      "lea         0x10(%0),%0                   \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "punpcklbw   %%xmm1,%%xmm0                 \n"
      "punpckhbw   %%xmm1,%%xmm2                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "movdqu      %%xmm2,0x10(%2)               \n"
      "lea         0x20(%2),%2                   \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_u),   // %0
        "+r"(src_v),   // %1
        "+r"(dst_uv),  // %2
        "+r"(width)    // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}